

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerImpl::HandleRlyRx(CommissionerImpl *this,Request *aRlyRx)

{
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *pfVar2;
  char cVar3;
  undefined4 uVar4;
  ushort uVar5;
  int iVar6;
  mapped_type *pmVar7;
  ByteArray *pBVar8;
  char *pcVar9;
  iterator __position;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ByteArray *aBytes;
  TimePoint *aTimePoint;
  ByteArray *aBytes_00;
  ByteArray *aBytes_01;
  char *pcVar10;
  CommissionerImpl *pCVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>,_bool>
  pVar12;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  uint16_t joinerRouterLocator;
  string peerAddr;
  uint16_t joinerUdpPort;
  writer write;
  TlvPtr tlv;
  ByteArray joinerId;
  Error error;
  string joinerPSKd;
  ByteArray dtlsRecords;
  Address localAddr;
  ByteArray joinerIid;
  TlvSet tlvSet;
  undefined1 local_228 [38];
  uint16_t local_202;
  undefined1 local_200 [8];
  undefined1 *puStack_1f8;
  char local_1f0 [8];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  _Head_base<7UL,_ot::commissioner::Address_&,_false> _Stack_1d0;
  undefined1 local_1c8 [8];
  Address AStack_1c0;
  _Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  local_1a8;
  _Head_base<1UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false> _Stack_1a0;
  _Head_base<0UL,_ot::commissioner::CommissionerImpl_&,_false> local_198;
  undefined1 local_18a [2];
  undefined1 local_188 [32];
  Tlv *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_160 [2];
  CommissionerImpl *local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  Address local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_88;
  string local_58;
  
  local_128._M_p = (pointer)&local_118;
  local_130._0_4_ = kNone;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_168 = (Tlv *)0x0;
  a_Stack_160[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (byte *)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150 = this;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  commissioner::tlv::GetTlvSet((Error *)local_1d8,(TlvSet *)&local_88,&aRlyRx->mPayload,kMeshCoP);
  local_130._0_4_ = local_1d8._0_4_;
  std::__cxx11::string::operator=((string *)&local_128,(string *)&_Stack_1d0);
  uVar4 = local_130._0_4_;
  if (_Stack_1d0._M_head_impl != &AStack_1c0) {
    operator_delete(_Stack_1d0._M_head_impl);
  }
  if (uVar4 != none_type) goto LAB_001ca2ec;
  local_1d8[0] = (string)0x12;
  pmVar7 = std::
           map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
           ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                         *)&local_88,(key_type *)local_1d8);
  local_168 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (a_Stack_160,
             &(pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  if (local_168 == (Tlv *)0x0) {
    local_1d8 = (undefined1  [8])((ulong)((uint7)local_1d8._1_7_ >> 0x18) << 0x20);
    pcVar9 = "no valid Joiner UDP Port TLV found";
    _Stack_1d0._M_head_impl = (Address *)0x24a264;
    local_1c8 = (undefined1  [8])0x22;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (undefined1 *)0x0;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1d8;
    local_188._0_8_ =
         (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_1d8;
    do {
      cVar3 = *pcVar9;
      pcVar10 = pcVar9;
      while (cVar3 != '{') {
        pcVar10 = pcVar10 + 1;
        if (pcVar10 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)local_188,pcVar9,"");
          goto LAB_001c9e7f;
        }
        cVar3 = *pcVar10;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()((writer *)local_188,pcVar9,pcVar10);
      pcVar9 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar10,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_1d8);
    } while (pcVar9 != "");
LAB_001c9e7f:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_1d8;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_228,(v10 *)"no valid Joiner UDP Port TLV found",
               (string_view)ZEXT816(0x22),args);
    local_200._0_4_ = 8;
    puStack_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&puStack_1f8,local_228._0_8_,
               (pointer)(local_228._0_8_ + (long)(ByteArray *)local_228._8_8_));
LAB_001ca2a4:
    local_130._0_4_ = local_200._0_4_;
    std::__cxx11::string::operator=((string *)&local_128,(string *)&puStack_1f8);
    if (puStack_1f8 != local_1e8) {
LAB_001ca2cc:
      operator_delete(puStack_1f8);
    }
  }
  else {
    local_18a = (undefined1  [2])commissioner::tlv::Tlv::GetValueAsUint16(local_168);
    local_1d8[0] = (string)0x14;
    pmVar7 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_88,(key_type *)local_1d8);
    local_168 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>)
                ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (a_Stack_160,
               &(pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount);
    if (local_168 == (Tlv *)0x0) {
      local_1d8 = (undefined1  [8])((ulong)((uint7)local_1d8._1_7_ >> 0x18) << 0x20);
      pcVar9 = "no valid Joiner Router Locator TLV found";
      _Stack_1d0._M_head_impl = (Address *)0x24a287;
      local_1c8 = (undefined1  [8])0x28;
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (undefined1 *)0x0;
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1d8;
      local_188._0_8_ =
           (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_1d8;
      do {
        cVar3 = *pcVar9;
        pcVar10 = pcVar9;
        while (cVar3 != '{') {
          pcVar10 = pcVar10 + 1;
          if (pcVar10 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()((writer *)local_188,pcVar9,"");
            goto LAB_001c9f5e;
          }
          cVar3 = *pcVar10;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)local_188,pcVar9,pcVar10);
        pcVar9 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar10,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_1d8);
      } while (pcVar9 != "");
LAB_001c9f5e:
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)local_1d8;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_228,(v10 *)"no valid Joiner Router Locator TLV found",
                 (string_view)ZEXT816(0x28),args_00);
      local_200._0_4_ = 8;
      puStack_1f8 = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&puStack_1f8,local_228._0_8_,
                 (pointer)(local_228._0_8_ + (long)(ByteArray *)local_228._8_8_));
      goto LAB_001ca2a4;
    }
    local_202 = commissioner::tlv::Tlv::GetValueAsUint16(local_168);
    local_1d8[0] = (string)0x13;
    pmVar7 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_88,(key_type *)local_1d8);
    local_168 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>)
                ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (a_Stack_160,
               &(pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount);
    if (local_168 != (Tlv *)0x0) {
      pBVar8 = commissioner::tlv::Tlv::GetValue(local_168);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_a8,pBVar8);
      local_1d8[0] = (string)0x11;
      pmVar7 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&local_88,(key_type *)local_1d8);
      local_168 = (pmVar7->
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (a_Stack_160,
                 &(pmVar7->
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      local_188._0_8_ =
           (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_1d8;
      if (local_168 == (Tlv *)0x0) {
        local_1d8 = (undefined1  [8])((ulong)local_1d8 & 0xffffffff00000000);
        pcVar9 = "no valid Joiner DTLS Encapsulation TLV found";
        _Stack_1d0._M_head_impl = (Address *)0x24a2ce;
        local_1c8 = (undefined1  [8])0x2c;
        AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (undefined1 *)0x0;
        AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_1d8;
        do {
          cVar3 = *pcVar9;
          pcVar10 = pcVar9;
          while (cVar3 != '{') {
            pcVar10 = pcVar10 + 1;
            if (pcVar10 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)local_188,pcVar9,"");
              goto LAB_001ca260;
            }
            cVar3 = *pcVar10;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)local_188,pcVar9,pcVar10);
          pcVar9 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar10,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_1d8);
        } while (pcVar9 != "");
LAB_001ca260:
        args_03.field_1.args_ = in_R9.args_;
        args_03.desc_ = (unsigned_long_long)local_1d8;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_228,(v10 *)"no valid Joiner DTLS Encapsulation TLV found",
                   (string_view)ZEXT816(0x2c),args_03);
        local_200._0_4_ = 8;
        puStack_1f8 = local_1e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&puStack_1f8,local_228._0_8_,
                   (pointer)(local_228._0_8_ + (long)(ByteArray *)local_228._8_8_));
        goto LAB_001ca2a4;
      }
      pBVar8 = commissioner::tlv::Tlv::GetValue(local_168);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_e8,pBVar8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_148,&local_a8);
      *local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start =
           *local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ^ 2;
      local_200 = (undefined1  [8])local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"joiner-session","");
      local_1d8 = (undefined1  [8])0x20000000d;
      _Stack_1d0._M_head_impl._0_4_ = 4;
      pcVar9 = "received RLY_RX.ntf: joinerID={}, joinerRouterLocator={}, length={}";
      local_1c8 = (undefined1  [8])0x24a2fb;
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (undefined1 *)0x43;
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x300000000;
      local_1a8._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      _Stack_1a0._M_head_impl =
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           ::fmt::v10::detail::
           parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>;
      local_198._M_head_impl =
           (CommissionerImpl *)
           ::fmt::v10::detail::
           parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1d8;
      do {
        cVar3 = *pcVar9;
        pcVar10 = pcVar9;
        while (cVar3 != '{') {
          pcVar10 = pcVar10 + 1;
          if (pcVar10 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_unsigned_long>_>
            ::writer::operator()((writer *)local_188,pcVar9,"");
            pBVar8 = extraout_RDX_00;
            goto LAB_001ca0a7;
          }
          cVar3 = *pcVar10;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_unsigned_long>_>
        ::writer::operator()((writer *)local_188,pcVar9,pcVar10);
        pcVar9 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,unsigned_short,unsigned_long>&>
                           (pcVar10,"",
                            (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>
                             *)local_1d8);
        pBVar8 = extraout_RDX;
      } while (pcVar9 != "");
LAB_001ca0a7:
      utils::Hex_abi_cxx11_((string *)local_188,(utils *)&local_148,pBVar8);
      AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish +
           -(long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
      local_1c8 = (undefined1  [8])(ulong)local_202;
      local_1d8 = (undefined1  [8])local_188._0_8_;
      _Stack_1d0._M_head_impl = (Address *)local_188._8_8_;
      fmt.size_ = 0x42d;
      fmt.data_ = (char *)0x43;
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)local_1d8;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_228,
                 (v10 *)"received RLY_RX.ntf: joinerID={}, joinerRouterLocator={}, length={}",fmt,
                 args_02);
      Log(kDebug,(string *)local_200,(string *)local_228);
      if ((format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
          local_228._0_8_ !=
          (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
          (local_228 + 0x10)) {
        operator_delete((void *)local_228._0_8_);
      }
      if ((format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
          local_188._0_8_ !=
          (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
          (local_188 + 0x10)) {
        operator_delete((void *)local_188._0_8_);
      }
      if (local_200 != (undefined1  [8])local_1f0) {
        operator_delete((void *)local_200);
      }
      pCVar11 = local_150;
      this_00 = &local_150->mJoinerSessions;
      __position = std::
                   _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
                   ::find(&this_00->_M_t,&local_148);
      p_Var1 = &(pCVar11->mJoinerSessions)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)__position._M_node == p_Var1) {
LAB_001ca4f0:
        local_c8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (**pCVar11->mCommissionerHandler->_vptr_CommissionerHandler)
                  (local_1d8,pCVar11->mCommissionerHandler,&local_148);
        std::__cxx11::string::operator=((string *)&local_108,(string *)local_1d8);
        if (local_1d8 != (undefined1  [8])local_1c8) {
          operator_delete((void *)local_1d8);
        }
        if (local_108._M_string_length == 0) {
          local_1d8 = (undefined1  [8])local_1c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"joiner-session","");
          ::fmt::v10::detail::
          check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                    ();
          utils::Hex_abi_cxx11_((string *)local_228,(utils *)&local_148,aBytes_00);
          local_188._0_8_ = local_228._0_8_;
          local_188._8_8_ = local_228._8_8_;
          fmt_03.size_ = 0xd;
          fmt_03.data_ = (char *)0x19;
          args_07.field_1.args_ = in_R9.args_;
          args_07.desc_ = (unsigned_long_long)local_188;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_200,(v10 *)"joiner(ID={}) is disabled",fmt_03,args_07);
          Log(kInfo,(string *)local_1d8,(string *)local_200);
          if (local_200 != (undefined1  [8])local_1f0) {
            operator_delete((void *)local_200);
          }
          if ((format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
              local_228._0_8_ !=
              (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
              (local_228 + 0x10)) {
            operator_delete((void *)local_228._0_8_);
          }
          if (local_1d8 != (undefined1  [8])local_1c8) {
            operator_delete((void *)local_1d8);
          }
          ::fmt::v10::detail::
          check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                    ();
          utils::Hex_abi_cxx11_((string *)local_228,(utils *)&local_148,aBytes_01);
          local_188._0_8_ = local_228._0_8_;
          local_188._8_8_ = local_228._8_8_;
          fmt_04.size_ = 0xd;
          fmt_04.data_ = (char *)0x19;
          args_08.field_1.args_ = in_R9.args_;
          args_08.desc_ = (unsigned_long_long)local_188;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_200,(v10 *)"joiner(ID={}) is disabled",fmt_04,args_08);
          local_1d8._0_4_ = 0x10;
          _Stack_1d0._M_head_impl = &AStack_1c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&_Stack_1d0,local_200,puStack_1f8 + (long)local_200);
          local_130._0_4_ = local_1d8._0_4_;
          std::__cxx11::string::operator=((string *)&local_128,(string *)&_Stack_1d0);
          if (_Stack_1d0._M_head_impl != &AStack_1c0) {
            operator_delete(_Stack_1d0._M_head_impl);
          }
          if (local_200 != (undefined1  [8])local_1f0) {
            operator_delete((void *)local_200);
          }
          if ((format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
              local_228._0_8_ !=
              (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
              (local_228 + 0x10)) {
            operator_delete((void *)local_228._0_8_);
          }
        }
        else {
          coap::CoapSecure::GetLocalAddr((Error *)local_1d8,&local_150->mBrClient,&local_c8);
          local_130._0_4_ = local_1d8._0_4_;
          std::__cxx11::string::operator=((string *)&local_128,(string *)&_Stack_1d0);
          uVar4 = local_130._0_4_;
          if (_Stack_1d0._M_head_impl != &AStack_1c0) {
            operator_delete(_Stack_1d0._M_head_impl);
          }
          if (uVar4 == none_type) {
            local_228._0_8_ = &local_148;
            (*aRlyRx->mEndpoint->_vptr_Endpoint[3])(local_200);
            iVar6 = (*aRlyRx->mEndpoint->_vptr_Endpoint[4])();
            pCVar11 = local_150;
            local_188._0_2_ = (short)iVar6;
            local_1d8 = (undefined1  [8])&kListeningJoinerPort;
            _Stack_1d0._M_head_impl = &local_c8;
            local_1c8 = (undefined1  [8])local_188;
            AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_202;
            AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = local_18a;
            local_1a8._M_head_impl = &local_108;
            local_198._M_head_impl = local_150;
            AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = local_200;
            _Stack_1a0._M_head_impl = &local_148;
            pVar12 = std::
                     _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                     ::
                     _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>&>,std::tuple<ot::commissioner::CommissionerImpl&,std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string&,unsigned_short&,unsigned_short&,ot::commissioner::Address&&,unsigned_short&&,ot::commissioner::Address&,unsigned_short_const&>>
                               ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                                 *)this_00,(piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                                 *)local_228,
                                (tuple<ot::commissioner::CommissionerImpl_&,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short_&,_unsigned_short_&,_ot::commissioner::Address_&&,_unsigned_short_&&,_ot::commissioner::Address_&,_const_unsigned_short_&>
                                 *)local_1d8);
            __position._M_node = (_Base_ptr)pVar12.first._M_node;
            if (local_200 != (undefined1  [8])0x0) {
              operator_delete((void *)local_200);
            }
            (**(code **)(**(long **)(__position._M_node + 5) + 0x18))(local_1d8);
            pfVar2 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                     (local_228 + 0x10);
            Address::ToString_abi_cxx11_((string *)local_200,(Address *)local_1d8);
            if (local_1d8 != (undefined1  [8])0x0) {
              operator_delete((void *)local_1d8);
            }
            local_228._0_8_ = pfVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"joiner-session","")
            ;
            ::fmt::v10::detail::
            check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short,_FMT_COMPILE_STRING,_0>
                      ();
            utils::Hex_abi_cxx11_(&local_58,(utils *)&local_148,aBytes);
            uVar5 = (**(code **)(**(long **)(__position._M_node + 5) + 0x20))();
            AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)uVar5;
            local_1d8 = (undefined1  [8])local_58._M_dataplus._M_p;
            _Stack_1d0._M_head_impl = (Address *)local_58._M_string_length;
            local_1c8 = local_200;
            AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = puStack_1f8;
            fmt_01.size_ = 0x2dd;
            fmt_01.data_ = (char *)0x39;
            args_05.field_1.args_ = in_R9.args_;
            args_05.desc_ = (unsigned_long_long)local_1d8;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_188,
                       (v10 *)"received a new joiner(ID={}) DTLS connection from [{}]:{}",fmt_01,
                       args_05);
            Log(kDebug,(string *)local_228,(string *)local_188);
            if ((format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                local_188._0_8_ !=
                (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                (local_188 + 0x10)) {
              operator_delete((void *)local_188._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
            if ((format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                local_228._0_8_ != pfVar2) {
              operator_delete((void *)local_228._0_8_);
            }
            JoinerSession::Connect((JoinerSession *)&__position._M_node[1]._M_right);
            local_1d8 = (undefined1  [8])local_1c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"joiner-session","")
            ;
            ::fmt::v10::detail::
            check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                      ();
            TimePointToString_abi_cxx11_
                      ((string *)local_188,(commissioner *)(__position._M_node + 0x19),aTimePoint);
            local_58._M_dataplus._M_p = (pointer)local_188._0_8_;
            local_58._M_string_length = local_188._8_8_;
            fmt_02.size_ = 0xd;
            fmt_02.data_ = (char *)0x30;
            args_06.field_1.args_ = in_R9.args_;
            args_06.desc_ = (unsigned_long_long)&local_58;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_228,(v10 *)"joiner session timer started, expiration-time={}"
                       ,fmt_02,args_06);
            Log(kInfo,(string *)local_1d8,(string *)local_228);
            if ((format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                local_228._0_8_ != pfVar2) {
              operator_delete((void *)local_228._0_8_);
            }
            if ((format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                local_188._0_8_ !=
                (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                (local_188 + 0x10)) {
              operator_delete((void *)local_188._0_8_);
            }
            if (local_1d8 != (undefined1  [8])local_1c8) {
              operator_delete((void *)local_1d8);
            }
            Timer::Start(&pCVar11->mJoinerSessionTimer,
                         (duration)*(duration *)(__position._M_node + 0x19));
            if (local_200 != (undefined1  [8])local_1f0) {
              operator_delete((void *)local_200);
            }
            if (local_c8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c8.mBytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_001ca198;
          }
        }
        if (local_c8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.mBytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      else {
        if (*(int *)(*(long *)(__position._M_node + 5) + 0xf8) == 0) {
          std::
          _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
          ::erase_abi_cxx11_((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                              *)this_00,__position);
          pCVar11 = local_150;
          goto LAB_001ca4f0;
        }
LAB_001ca198:
        if ((_Rb_tree_header *)__position._M_node == p_Var1) {
          __assert_fail("condition",
                        "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp"
                        ,0xa34,
                        "void ot::commissioner::CommissionerImpl::HandleRlyRx(const coap::Request &)"
                       );
        }
        JoinerSession::RecvJoinerDtlsRecords
                  ((JoinerSession *)&__position._M_node[1]._M_right,&local_e8);
      }
      goto LAB_001ca2ec;
    }
    local_1d8 = (undefined1  [8])((ulong)((uint7)local_1d8._1_7_ >> 0x18) << 0x20);
    _Stack_1d0._M_head_impl = (Address *)0x24a2b0;
    local_1c8 = (undefined1  [8])0x1d;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (undefined1 *)0x0;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar9 = "no valid Joiner IID TLV found";
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1d8;
    do {
      pcVar10 = pcVar9 + 1;
      if (*pcVar9 == '}') {
        if ((pcVar10 == "") || (*pcVar10 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar10 = pcVar9 + 2;
      }
      else if (*pcVar9 == '{') {
        pcVar10 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar9,"",
                             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_1d8);
      }
      pcVar9 = pcVar10;
    } while (pcVar10 != "");
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)local_1d8;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_228,(v10 *)"no valid Joiner IID TLV found",(string_view)ZEXT816(0x1d)
               ,args_01);
    local_200._0_4_ = 8;
    puStack_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&puStack_1f8,local_228._0_8_,
               (pointer)(local_228._0_8_ + (long)(ByteArray *)local_228._8_8_));
    local_130._0_4_ = local_200._0_4_;
    std::__cxx11::string::operator=((string *)&local_128,(string *)&puStack_1f8);
    if (puStack_1f8 != local_1e8) goto LAB_001ca2cc;
  }
  if ((format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_228._0_8_ !=
      (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)(local_228 + 0x10)
     ) {
    operator_delete((void *)local_228._0_8_);
  }
LAB_001ca2ec:
  if (local_130._0_4_ != none_type) {
    local_200 = (undefined1  [8])local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"joiner-session","");
    local_1d8._0_4_ = 0xd;
    pcVar9 = "failed to handle RLY_RX.ntf message: {}";
    _Stack_1d0._M_head_impl = (Address *)0x24a3c4;
    local_1c8 = (undefined1  [8])0x27;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (undefined1 *)0x100000000;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = local_1d8;
    AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_188._0_8_ =
         AStack_1c0.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish;
    do {
      cVar3 = *pcVar9;
      pcVar10 = pcVar9;
      while (cVar3 != '{') {
        pcVar10 = pcVar10 + 1;
        if (pcVar10 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_188,pcVar9,"");
          goto LAB_001ca3c7;
        }
        cVar3 = *pcVar10;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()((writer *)local_188,pcVar9,pcVar10);
      pcVar9 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar10,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_1d8);
    } while (pcVar9 != "");
LAB_001ca3c7:
    Error::ToString_abi_cxx11_((string *)local_1d8,(Error *)local_130);
    local_188._0_8_ = local_1d8;
    local_188._8_8_ = _Stack_1d0._M_head_impl;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x27;
    args_04.field_1.args_ = in_R9.args_;
    args_04.desc_ = (unsigned_long_long)local_188;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_228,(v10 *)"failed to handle RLY_RX.ntf message: {}",fmt_00,args_04);
    Log(kError,(string *)local_200,(string *)local_228);
    if ((format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_228._0_8_
        != (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
           (local_228 + 0x10)) {
      operator_delete((void *)local_228._0_8_);
    }
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if (local_200 != (undefined1  [8])local_1f0) {
      operator_delete((void *)local_200);
    }
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (a_Stack_160[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_160[0]._M_pi);
  }
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p != &local_118) {
    operator_delete(local_128._M_p);
  }
  return;
}

Assistant:

void CommissionerImpl::HandleRlyRx(const coap::Request &aRlyRx)
{
    Error       error;
    tlv::TlvSet tlvSet;
    tlv::TlvPtr tlv;

    std::string joinerPSKd;
    uint16_t    joinerUdpPort;
    uint16_t    joinerRouterLocator;
    ByteArray   joinerIid;
    ByteArray   joinerId;
    ByteArray   dtlsRecords;

    SuccessOrExit(error = GetTlvSet(tlvSet, aRlyRx));

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerUdpPort]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner UDP Port TLV found"));
    joinerUdpPort = tlv->GetValueAsUint16();

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerRouterLocator]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner Router Locator TLV found"));
    joinerRouterLocator = tlv->GetValueAsUint16();

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerIID]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner IID TLV found"));
    joinerIid = tlv->GetValue();

    VerifyOrExit((tlv = tlvSet[tlv::Type::kJoinerDtlsEncapsulation]) != nullptr,
                 error = ERROR_BAD_FORMAT("no valid Joiner DTLS Encapsulation TLV found"));
    dtlsRecords = tlv->GetValue();

    joinerId = joinerIid;
    joinerId[0] ^= kLocalExternalAddrMask;
    LOG_DEBUG(LOG_REGION_JOINER_SESSION, "received RLY_RX.ntf: joinerID={}, joinerRouterLocator={}, length={}",
              utils::Hex(joinerId), joinerRouterLocator, dtlsRecords.size());

    {
        auto it = mJoinerSessions.find(joinerId);
        if (it != mJoinerSessions.end() && it->second.Disabled())
        {
            mJoinerSessions.erase(it);
            it = mJoinerSessions.end();
        }

        if (it == mJoinerSessions.end())
        {
            Address localAddr;

            joinerPSKd = mCommissionerHandler.OnJoinerRequest(joinerId);
            if (joinerPSKd.empty())
            {
                LOG_INFO(LOG_REGION_JOINER_SESSION, "joiner(ID={}) is disabled", utils::Hex(joinerId));
                ExitNow(error = ERROR_REJECTED("joiner(ID={}) is disabled", utils::Hex(joinerId)));
            }

            SuccessOrExit(error = mBrClient.GetLocalAddr(localAddr));
            it = mJoinerSessions
                     .emplace(std::piecewise_construct, std::forward_as_tuple(joinerId),
                              std::forward_as_tuple(*this, joinerId, joinerPSKd, joinerUdpPort, joinerRouterLocator,
                                                    aRlyRx.GetEndpoint()->GetPeerAddr(),
                                                    aRlyRx.GetEndpoint()->GetPeerPort(), localAddr,
                                                    kListeningJoinerPort))
                     .first;
            auto &session = it->second;

            std::string peerAddr = session.GetPeerAddr().ToString();

            LOG_DEBUG(LOG_REGION_JOINER_SESSION, "received a new joiner(ID={}) DTLS connection from [{}]:{}",
                      utils::Hex(joinerId), peerAddr, session.GetPeerPort());

            session.Connect();

            LOG_INFO(LOG_REGION_JOINER_SESSION, "joiner session timer started, expiration-time={}",
                     TimePointToString(session.GetExpirationTime()));
            mJoinerSessionTimer.Start(session.GetExpirationTime());
        }

        ASSERT(it != mJoinerSessions.end());
        auto &session = it->second;
        session.RecvJoinerDtlsRecords(dtlsRecords);
    }

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_ERROR(LOG_REGION_JOINER_SESSION, "failed to handle RLY_RX.ntf message: {}", error.ToString());
    }
}